

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O3

int displayMessage(char *msg_buffer)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  long lVar49;
  undefined1 auVar50 [16];
  int iVar51;
  size_t sVar52;
  ulong uVar53;
  long lVar54;
  char *c;
  char *__dest;
  uint8_t *puVar55;
  uint8_t *puVar56;
  int iVar57;
  ulong uVar58;
  int y;
  ulong uVar59;
  int iVar77;
  undefined1 in_XMM1 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar79;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  long lVar78;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar83;
  undefined1 auVar80 [16];
  int iVar84;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  int iVar136;
  int iVar143;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int width;
  int line_count;
  undefined1 local_48 [16];
  long lVar87;
  
  uStack_60 = 0x11eef0;
  sVar52 = strlen(msg_buffer);
  lVar49 = -(sVar52 + 0x2f & 0xfffffffffffffff0);
  __dest = (char *)((long)&local_58 + lVar49);
  *(undefined8 *)((long)&uStack_60 + lVar49) = 0x11ef0c;
  strcpy(__dest,msg_buffer);
  *(undefined8 *)((long)&uStack_60 + lVar49) = 0x11ef2e;
  lineWrapString(__dest,0x15,"",&local_58,&local_54);
  *(undefined8 *)((long)&uStack_60 + lVar49) = 0x11ef33;
  drawMap();
  auVar50 = _DAT_00149470;
  iVar57 = local_58 * -4 + 0x80 >> 1;
  y = local_54 * -6 + 0x40 >> 1;
  iVar51 = iVar57;
  if (-1 < local_58) {
    uVar53 = (ulong)(local_54 * 6 + 5);
    lVar54 = uVar53 - 1;
    local_48._8_4_ = (int)lVar54;
    local_48._0_8_ = lVar54;
    local_48._12_4_ = (int)((ulong)lVar54 >> 0x20);
    _width = (long)y * 0x80;
    puVar56 = jedi_screen_buffer + _width + iVar57;
    uVar59 = 0;
    do {
      if (-1 < local_54) {
        uVar58 = 0;
        auVar85 = _DAT_001494b0;
        auVar88 = _DAT_001494c0;
        auVar90 = _DAT_001494d0;
        auVar92 = _DAT_001494e0;
        auVar144 = _DAT_00149460;
        auVar146 = _DAT_00149510;
        auVar148 = _DAT_00149500;
        auVar150 = _DAT_001494f0;
        do {
          auVar80 = local_48 ^ auVar50;
          auVar111 = auVar144 ^ auVar50;
          iVar77 = auVar80._0_4_;
          iVar136 = -(uint)(iVar77 < auVar111._0_4_);
          iVar79 = auVar80._4_4_;
          auVar113._4_4_ = -(uint)(iVar79 < auVar111._4_4_);
          iVar83 = auVar80._8_4_;
          iVar143 = -(uint)(iVar83 < auVar111._8_4_);
          iVar84 = auVar80._12_4_;
          auVar113._12_4_ = -(uint)(iVar84 < auVar111._12_4_);
          auVar80._4_4_ = iVar136;
          auVar80._0_4_ = iVar136;
          auVar80._8_4_ = iVar143;
          auVar80._12_4_ = iVar143;
          auVar94 = pshuflw(in_XMM7,auVar80,0xe8);
          auVar112._4_4_ = -(uint)(auVar111._4_4_ == iVar79);
          auVar112._12_4_ = -(uint)(auVar111._12_4_ == iVar84);
          auVar112._0_4_ = auVar112._4_4_;
          auVar112._8_4_ = auVar112._12_4_;
          auVar80 = pshuflw(in_XMM1,auVar112,0xe8);
          auVar113._0_4_ = auVar113._4_4_;
          auVar113._8_4_ = auVar113._12_4_;
          auVar95 = pshuflw(auVar94,auVar113,0xe8);
          auVar111._8_4_ = 0xffffffff;
          auVar111._0_8_ = 0xffffffffffffffff;
          auVar111._12_4_ = 0xffffffff;
          auVar111 = (auVar95 | auVar80 & auVar94) ^ auVar111;
          auVar80 = packssdw(auVar111,auVar111);
          if ((auVar80 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar56[uVar58 - 0x102] = 0xff;
          }
          auVar94._4_4_ = iVar136;
          auVar94._0_4_ = iVar136;
          auVar94._8_4_ = iVar143;
          auVar94._12_4_ = iVar143;
          auVar113 = auVar112 & auVar94 | auVar113;
          auVar80 = packssdw(auVar113,auVar113);
          auVar95._8_4_ = 0xffffffff;
          auVar95._0_8_ = 0xffffffffffffffff;
          auVar95._12_4_ = 0xffffffff;
          auVar80 = packssdw(auVar80 ^ auVar95,auVar80 ^ auVar95);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80._0_4_ >> 8 & 1) != 0) {
            puVar56[uVar58 - 0x82] = 0xff;
          }
          auVar80 = auVar146 ^ auVar50;
          auVar96._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
          auVar96._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
          auVar96._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
          auVar96._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
          auVar114._4_4_ = auVar96._0_4_;
          auVar114._0_4_ = auVar96._0_4_;
          auVar114._8_4_ = auVar96._8_4_;
          auVar114._12_4_ = auVar96._8_4_;
          iVar136 = -(uint)(auVar80._4_4_ == iVar79);
          iVar143 = -(uint)(auVar80._12_4_ == iVar84);
          auVar2._4_4_ = iVar136;
          auVar2._0_4_ = iVar136;
          auVar2._8_4_ = iVar143;
          auVar2._12_4_ = iVar143;
          auVar137._4_4_ = auVar96._4_4_;
          auVar137._0_4_ = auVar96._4_4_;
          auVar137._8_4_ = auVar96._12_4_;
          auVar137._12_4_ = auVar96._12_4_;
          auVar80 = auVar2 & auVar114 | auVar137;
          auVar80 = packssdw(auVar80,auVar80);
          auVar30._8_4_ = 0xffffffff;
          auVar30._0_8_ = 0xffffffffffffffff;
          auVar30._12_4_ = 0xffffffff;
          auVar80 = packssdw(auVar80 ^ auVar30,auVar80 ^ auVar30);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80._0_4_ >> 0x10 & 1) != 0) {
            puVar56[uVar58 - 2] = 0xff;
          }
          auVar80 = pshufhw(auVar80,auVar114,0x84);
          auVar3._4_4_ = iVar136;
          auVar3._0_4_ = iVar136;
          auVar3._8_4_ = iVar143;
          auVar3._12_4_ = iVar143;
          auVar94 = pshufhw(auVar96,auVar3,0x84);
          auVar111 = pshufhw(auVar80,auVar137,0x84);
          auVar60._8_4_ = 0xffffffff;
          auVar60._0_8_ = 0xffffffffffffffff;
          auVar60._12_4_ = 0xffffffff;
          auVar60 = (auVar111 | auVar94 & auVar80) ^ auVar60;
          auVar80 = packssdw(auVar60,auVar60);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80._0_4_ >> 0x18 & 1) != 0) {
            puVar56[uVar58 + 0x7e] = 0xff;
          }
          auVar80 = auVar148 ^ auVar50;
          auVar97._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
          auVar97._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
          auVar97._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
          auVar97._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
          auVar4._4_4_ = auVar97._0_4_;
          auVar4._0_4_ = auVar97._0_4_;
          auVar4._8_4_ = auVar97._8_4_;
          auVar4._12_4_ = auVar97._8_4_;
          auVar94 = pshuflw(auVar137,auVar4,0xe8);
          auVar61._0_4_ = -(uint)(auVar80._0_4_ == iVar77);
          auVar61._4_4_ = -(uint)(auVar80._4_4_ == iVar79);
          auVar61._8_4_ = -(uint)(auVar80._8_4_ == iVar83);
          auVar61._12_4_ = -(uint)(auVar80._12_4_ == iVar84);
          auVar115._4_4_ = auVar61._4_4_;
          auVar115._0_4_ = auVar61._4_4_;
          auVar115._8_4_ = auVar61._12_4_;
          auVar115._12_4_ = auVar61._12_4_;
          auVar80 = pshuflw(auVar61,auVar115,0xe8);
          auVar116._4_4_ = auVar97._4_4_;
          auVar116._0_4_ = auVar97._4_4_;
          auVar116._8_4_ = auVar97._12_4_;
          auVar116._12_4_ = auVar97._12_4_;
          auVar111 = pshuflw(auVar97,auVar116,0xe8);
          auVar31._8_4_ = 0xffffffff;
          auVar31._0_8_ = 0xffffffffffffffff;
          auVar31._12_4_ = 0xffffffff;
          auVar80 = packssdw(auVar80 & auVar94,(auVar111 | auVar80 & auVar94) ^ auVar31);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar56[uVar58 + 0xfe] = 0xff;
          }
          auVar5._4_4_ = auVar97._0_4_;
          auVar5._0_4_ = auVar97._0_4_;
          auVar5._8_4_ = auVar97._8_4_;
          auVar5._12_4_ = auVar97._8_4_;
          auVar116 = auVar115 & auVar5 | auVar116;
          auVar111 = packssdw(auVar116,auVar116);
          auVar32._8_4_ = 0xffffffff;
          auVar32._0_8_ = 0xffffffffffffffff;
          auVar32._12_4_ = 0xffffffff;
          auVar80 = packssdw(auVar80,auVar111 ^ auVar32);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80._4_2_ >> 8 & 1) != 0) {
            puVar56[uVar58 + 0x17e] = 0xff;
          }
          auVar80 = auVar150 ^ auVar50;
          auVar98._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
          auVar98._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
          auVar98._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
          auVar98._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
          auVar117._4_4_ = auVar98._0_4_;
          auVar117._0_4_ = auVar98._0_4_;
          auVar117._8_4_ = auVar98._8_4_;
          auVar117._12_4_ = auVar98._8_4_;
          iVar136 = -(uint)(auVar80._4_4_ == iVar79);
          iVar143 = -(uint)(auVar80._12_4_ == iVar84);
          auVar6._4_4_ = iVar136;
          auVar6._0_4_ = iVar136;
          auVar6._8_4_ = iVar143;
          auVar6._12_4_ = iVar143;
          auVar138._4_4_ = auVar98._4_4_;
          auVar138._0_4_ = auVar98._4_4_;
          auVar138._8_4_ = auVar98._12_4_;
          auVar138._12_4_ = auVar98._12_4_;
          auVar80 = auVar6 & auVar117 | auVar138;
          auVar80 = packssdw(auVar80,auVar80);
          auVar33._8_4_ = 0xffffffff;
          auVar33._0_8_ = 0xffffffffffffffff;
          auVar33._12_4_ = 0xffffffff;
          auVar80 = packssdw(auVar80 ^ auVar33,auVar80 ^ auVar33);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar56[uVar58 + 0x1fe] = 0xff;
          }
          auVar80 = pshufhw(auVar80,auVar117,0x84);
          auVar7._4_4_ = iVar136;
          auVar7._0_4_ = iVar136;
          auVar7._8_4_ = iVar143;
          auVar7._12_4_ = iVar143;
          auVar94 = pshufhw(auVar98,auVar7,0x84);
          auVar111 = pshufhw(auVar80,auVar138,0x84);
          auVar62._8_4_ = 0xffffffff;
          auVar62._0_8_ = 0xffffffffffffffff;
          auVar62._12_4_ = 0xffffffff;
          auVar62 = (auVar111 | auVar94 & auVar80) ^ auVar62;
          auVar80 = packssdw(auVar62,auVar62);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80._6_2_ >> 8 & 1) != 0) {
            puVar56[uVar58 + 0x27e] = 0xff;
          }
          auVar80 = auVar92 ^ auVar50;
          auVar99._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
          auVar99._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
          auVar99._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
          auVar99._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
          auVar8._4_4_ = auVar99._0_4_;
          auVar8._0_4_ = auVar99._0_4_;
          auVar8._8_4_ = auVar99._8_4_;
          auVar8._12_4_ = auVar99._8_4_;
          auVar94 = pshuflw(auVar138,auVar8,0xe8);
          auVar63._0_4_ = -(uint)(auVar80._0_4_ == iVar77);
          auVar63._4_4_ = -(uint)(auVar80._4_4_ == iVar79);
          auVar63._8_4_ = -(uint)(auVar80._8_4_ == iVar83);
          auVar63._12_4_ = -(uint)(auVar80._12_4_ == iVar84);
          auVar118._4_4_ = auVar63._4_4_;
          auVar118._0_4_ = auVar63._4_4_;
          auVar118._8_4_ = auVar63._12_4_;
          auVar118._12_4_ = auVar63._12_4_;
          auVar80 = pshuflw(auVar63,auVar118,0xe8);
          auVar119._4_4_ = auVar99._4_4_;
          auVar119._0_4_ = auVar99._4_4_;
          auVar119._8_4_ = auVar99._12_4_;
          auVar119._12_4_ = auVar99._12_4_;
          auVar111 = pshuflw(auVar99,auVar119,0xe8);
          auVar100._8_4_ = 0xffffffff;
          auVar100._0_8_ = 0xffffffffffffffff;
          auVar100._12_4_ = 0xffffffff;
          auVar100 = (auVar111 | auVar80 & auVar94) ^ auVar100;
          auVar111 = packssdw(auVar100,auVar100);
          auVar80 = packsswb(auVar80 & auVar94,auVar111);
          if ((auVar80 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar56[uVar58 + 0x2fe] = 0xff;
          }
          auVar9._4_4_ = auVar99._0_4_;
          auVar9._0_4_ = auVar99._0_4_;
          auVar9._8_4_ = auVar99._8_4_;
          auVar9._12_4_ = auVar99._8_4_;
          auVar119 = auVar118 & auVar9 | auVar119;
          auVar111 = packssdw(auVar119,auVar119);
          auVar34._8_4_ = 0xffffffff;
          auVar34._0_8_ = 0xffffffffffffffff;
          auVar34._12_4_ = 0xffffffff;
          auVar111 = packssdw(auVar111 ^ auVar34,auVar111 ^ auVar34);
          auVar80 = packsswb(auVar80,auVar111);
          if ((auVar80._8_2_ >> 8 & 1) != 0) {
            puVar56[uVar58 + 0x37e] = 0xff;
          }
          auVar80 = auVar90 ^ auVar50;
          auVar101._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
          auVar101._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
          auVar101._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
          auVar101._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
          auVar120._4_4_ = auVar101._0_4_;
          auVar120._0_4_ = auVar101._0_4_;
          auVar120._8_4_ = auVar101._8_4_;
          auVar120._12_4_ = auVar101._8_4_;
          iVar136 = -(uint)(auVar80._4_4_ == iVar79);
          iVar143 = -(uint)(auVar80._12_4_ == iVar84);
          auVar10._4_4_ = iVar136;
          auVar10._0_4_ = iVar136;
          auVar10._8_4_ = iVar143;
          auVar10._12_4_ = iVar143;
          auVar139._4_4_ = auVar101._4_4_;
          auVar139._0_4_ = auVar101._4_4_;
          auVar139._8_4_ = auVar101._12_4_;
          auVar139._12_4_ = auVar101._12_4_;
          auVar80 = auVar10 & auVar120 | auVar139;
          auVar80 = packssdw(auVar80,auVar80);
          auVar35._8_4_ = 0xffffffff;
          auVar35._0_8_ = 0xffffffffffffffff;
          auVar35._12_4_ = 0xffffffff;
          auVar80 = packssdw(auVar80 ^ auVar35,auVar80 ^ auVar35);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar56[uVar58 + 0x3fe] = 0xff;
          }
          auVar80 = pshufhw(auVar80,auVar120,0x84);
          auVar11._4_4_ = iVar136;
          auVar11._0_4_ = iVar136;
          auVar11._8_4_ = iVar143;
          auVar11._12_4_ = iVar143;
          auVar94 = pshufhw(auVar101,auVar11,0x84);
          auVar111 = pshufhw(auVar80,auVar139,0x84);
          auVar64._8_4_ = 0xffffffff;
          auVar64._0_8_ = 0xffffffffffffffff;
          auVar64._12_4_ = 0xffffffff;
          auVar64 = (auVar111 | auVar94 & auVar80) ^ auVar64;
          auVar80 = packssdw(auVar64,auVar64);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80._10_2_ >> 8 & 1) != 0) {
            puVar56[uVar58 + 0x47e] = 0xff;
          }
          auVar80 = auVar88 ^ auVar50;
          auVar102._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
          auVar102._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
          auVar102._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
          auVar102._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
          auVar12._4_4_ = auVar102._0_4_;
          auVar12._0_4_ = auVar102._0_4_;
          auVar12._8_4_ = auVar102._8_4_;
          auVar12._12_4_ = auVar102._8_4_;
          auVar94 = pshuflw(auVar139,auVar12,0xe8);
          auVar65._0_4_ = -(uint)(auVar80._0_4_ == iVar77);
          auVar65._4_4_ = -(uint)(auVar80._4_4_ == iVar79);
          auVar65._8_4_ = -(uint)(auVar80._8_4_ == iVar83);
          auVar65._12_4_ = -(uint)(auVar80._12_4_ == iVar84);
          auVar121._4_4_ = auVar65._4_4_;
          auVar121._0_4_ = auVar65._4_4_;
          auVar121._8_4_ = auVar65._12_4_;
          auVar121._12_4_ = auVar65._12_4_;
          auVar80 = pshuflw(auVar65,auVar121,0xe8);
          auVar122._4_4_ = auVar102._4_4_;
          auVar122._0_4_ = auVar102._4_4_;
          auVar122._8_4_ = auVar102._12_4_;
          auVar122._12_4_ = auVar102._12_4_;
          auVar111 = pshuflw(auVar102,auVar122,0xe8);
          auVar36._8_4_ = 0xffffffff;
          auVar36._0_8_ = 0xffffffffffffffff;
          auVar36._12_4_ = 0xffffffff;
          auVar80 = packssdw(auVar80 & auVar94,(auVar111 | auVar80 & auVar94) ^ auVar36);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar56[uVar58 + 0x4fe] = 0xff;
          }
          auVar13._4_4_ = auVar102._0_4_;
          auVar13._0_4_ = auVar102._0_4_;
          auVar13._8_4_ = auVar102._8_4_;
          auVar13._12_4_ = auVar102._8_4_;
          auVar122 = auVar121 & auVar13 | auVar122;
          auVar111 = packssdw(auVar122,auVar122);
          auVar37._8_4_ = 0xffffffff;
          auVar37._0_8_ = 0xffffffffffffffff;
          auVar37._12_4_ = 0xffffffff;
          auVar80 = packssdw(auVar80,auVar111 ^ auVar37);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80._12_2_ >> 8 & 1) != 0) {
            puVar56[uVar58 + 0x57e] = 0xff;
          }
          auVar80 = auVar85 ^ auVar50;
          in_XMM7._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
          in_XMM7._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
          in_XMM7._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
          in_XMM7._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
          auVar123._4_4_ = in_XMM7._0_4_;
          auVar123._0_4_ = in_XMM7._0_4_;
          auVar123._8_4_ = in_XMM7._8_4_;
          auVar123._12_4_ = in_XMM7._8_4_;
          iVar77 = -(uint)(auVar80._4_4_ == iVar79);
          iVar79 = -(uint)(auVar80._12_4_ == iVar84);
          auVar81._4_4_ = iVar77;
          auVar81._0_4_ = iVar77;
          auVar81._8_4_ = iVar79;
          auVar81._12_4_ = iVar79;
          auVar66._4_4_ = in_XMM7._4_4_;
          auVar66._0_4_ = in_XMM7._4_4_;
          auVar66._8_4_ = in_XMM7._12_4_;
          auVar66._12_4_ = in_XMM7._12_4_;
          auVar66 = auVar81 & auVar123 | auVar66;
          auVar80 = packssdw(auVar66,auVar66);
          auVar38._8_4_ = 0xffffffff;
          auVar38._0_8_ = 0xffffffffffffffff;
          auVar38._12_4_ = 0xffffffff;
          auVar80 = packssdw(auVar80 ^ auVar38,auVar80 ^ auVar38);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar56[uVar58 + 0x5fe] = 0xff;
          }
          auVar80 = pshufhw(auVar80,auVar123,0x84);
          auVar94 = pshufhw(auVar81,auVar81,0x84);
          auVar14._4_4_ = in_XMM7._4_4_;
          auVar14._0_4_ = in_XMM7._4_4_;
          auVar14._8_4_ = in_XMM7._12_4_;
          auVar14._12_4_ = in_XMM7._12_4_;
          auVar111 = pshufhw(auVar80,auVar14,0x84);
          auVar67._8_4_ = 0xffffffff;
          auVar67._0_8_ = 0xffffffffffffffff;
          auVar67._12_4_ = 0xffffffff;
          auVar67 = (auVar111 | auVar94 & auVar80) ^ auVar67;
          auVar80 = packssdw(auVar67,auVar67);
          auVar80 = packsswb(auVar80,auVar80);
          if ((auVar80._14_2_ >> 8 & 1) != 0) {
            puVar56[uVar58 + 0x67e] = 0xff;
          }
          lVar54 = (long)DAT_00149520;
          lVar87 = auVar144._8_8_;
          auVar144._0_8_ = auVar144._0_8_ + lVar54;
          lVar78 = DAT_00149520._8_8_;
          auVar144._8_8_ = lVar87 + lVar78;
          lVar87 = auVar146._8_8_;
          auVar146._0_8_ = auVar146._0_8_ + lVar54;
          auVar146._8_8_ = lVar87 + lVar78;
          lVar87 = auVar148._8_8_;
          auVar148._0_8_ = auVar148._0_8_ + lVar54;
          auVar148._8_8_ = lVar87 + lVar78;
          lVar87 = auVar150._8_8_;
          auVar150._0_8_ = auVar150._0_8_ + lVar54;
          auVar150._8_8_ = lVar87 + lVar78;
          lVar87 = auVar92._8_8_;
          auVar92._0_8_ = auVar92._0_8_ + lVar54;
          auVar92._8_8_ = lVar87 + lVar78;
          lVar87 = auVar90._8_8_;
          auVar90._0_8_ = auVar90._0_8_ + lVar54;
          auVar90._8_8_ = lVar87 + lVar78;
          lVar87 = auVar88._8_8_;
          auVar88._0_8_ = auVar88._0_8_ + lVar54;
          auVar88._8_8_ = lVar87 + lVar78;
          lVar87 = auVar85._8_8_;
          auVar85._0_8_ = auVar85._0_8_ + lVar54;
          auVar85._8_8_ = lVar87 + lVar78;
          uVar58 = uVar58 + 0x800;
          in_XMM1 = _DAT_00149520;
        } while ((uVar53 * 0x80 + 0x780 & 0xfffffffffffff800) != uVar58);
      }
      uVar59 = uVar59 + 1;
      puVar56 = puVar56 + 1;
    } while (uVar59 != local_58 * 4 + 4);
    if (-1 < local_58) {
      uVar53 = (ulong)(local_54 * 6 + 2);
      lVar54 = uVar53 - 1;
      local_48._8_4_ = (int)lVar54;
      local_48._0_8_ = lVar54;
      local_48._12_4_ = (int)((ulong)lVar54 >> 0x20);
      puVar56 = jedi_screen_buffer + _width + iVar57;
      uVar59 = 0;
      do {
        uVar58 = uVar53 + 0xf & 0xfffffffffffffff0;
        puVar55 = puVar56;
        auVar85 = _DAT_001494b0;
        auVar88 = _DAT_001494c0;
        auVar90 = _DAT_001494d0;
        auVar92 = _DAT_001494e0;
        auVar144 = _DAT_00149460;
        auVar146 = _DAT_00149510;
        auVar148 = _DAT_00149500;
        auVar150 = _DAT_001494f0;
        if (-1 < local_54) {
          do {
            auVar111 = local_48 ^ auVar50;
            auVar80 = auVar144 ^ auVar50;
            iVar77 = auVar111._0_4_;
            iVar136 = -(uint)(iVar77 < auVar80._0_4_);
            iVar79 = auVar111._4_4_;
            auVar125._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
            iVar83 = auVar111._8_4_;
            iVar143 = -(uint)(iVar83 < auVar80._8_4_);
            iVar84 = auVar111._12_4_;
            auVar125._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
            auVar15._4_4_ = iVar136;
            auVar15._0_4_ = iVar136;
            auVar15._8_4_ = iVar143;
            auVar15._12_4_ = iVar143;
            auVar111 = pshuflw(in_XMM7,auVar15,0xe8);
            auVar68._0_4_ = -(uint)(auVar80._0_4_ == iVar77);
            auVar68._4_4_ = -(uint)(auVar80._4_4_ == iVar79);
            auVar68._8_4_ = -(uint)(auVar80._8_4_ == iVar83);
            auVar68._12_4_ = -(uint)(auVar80._12_4_ == iVar84);
            auVar124._4_4_ = auVar68._4_4_;
            auVar124._0_4_ = auVar68._4_4_;
            auVar124._8_4_ = auVar68._12_4_;
            auVar124._12_4_ = auVar68._12_4_;
            auVar80 = pshuflw(auVar68,auVar124,0xe8);
            auVar125._0_4_ = auVar125._4_4_;
            auVar125._8_4_ = auVar125._12_4_;
            auVar94 = pshuflw(auVar111,auVar125,0xe8);
            auVar103._8_4_ = 0xffffffff;
            auVar103._0_8_ = 0xffffffffffffffff;
            auVar103._12_4_ = 0xffffffff;
            auVar103 = (auVar94 | auVar80 & auVar111) ^ auVar103;
            auVar80 = packssdw(auVar103,auVar103);
            if ((auVar80 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar55[-0x81] = '\0';
            }
            auVar16._4_4_ = iVar136;
            auVar16._0_4_ = iVar136;
            auVar16._8_4_ = iVar143;
            auVar16._12_4_ = iVar143;
            auVar125 = auVar124 & auVar16 | auVar125;
            auVar80 = packssdw(auVar125,auVar125);
            auVar39._8_4_ = 0xffffffff;
            auVar39._0_8_ = 0xffffffffffffffff;
            auVar39._12_4_ = 0xffffffff;
            auVar80 = packssdw(auVar80 ^ auVar39,auVar80 ^ auVar39);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80._0_4_ >> 8 & 1) != 0) {
              puVar55[-1] = '\0';
            }
            auVar80 = auVar146 ^ auVar50;
            auVar104._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
            auVar104._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
            auVar104._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
            auVar104._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
            auVar126._4_4_ = auVar104._0_4_;
            auVar126._0_4_ = auVar104._0_4_;
            auVar126._8_4_ = auVar104._8_4_;
            auVar126._12_4_ = auVar104._8_4_;
            iVar136 = -(uint)(auVar80._4_4_ == iVar79);
            iVar143 = -(uint)(auVar80._12_4_ == iVar84);
            auVar17._4_4_ = iVar136;
            auVar17._0_4_ = iVar136;
            auVar17._8_4_ = iVar143;
            auVar17._12_4_ = iVar143;
            auVar140._4_4_ = auVar104._4_4_;
            auVar140._0_4_ = auVar104._4_4_;
            auVar140._8_4_ = auVar104._12_4_;
            auVar140._12_4_ = auVar104._12_4_;
            auVar80 = auVar17 & auVar126 | auVar140;
            auVar80 = packssdw(auVar80,auVar80);
            auVar40._8_4_ = 0xffffffff;
            auVar40._0_8_ = 0xffffffffffffffff;
            auVar40._12_4_ = 0xffffffff;
            auVar80 = packssdw(auVar80 ^ auVar40,auVar80 ^ auVar40);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80._0_4_ >> 0x10 & 1) != 0) {
              puVar55[0x7f] = '\0';
            }
            auVar80 = pshufhw(auVar80,auVar126,0x84);
            auVar18._4_4_ = iVar136;
            auVar18._0_4_ = iVar136;
            auVar18._8_4_ = iVar143;
            auVar18._12_4_ = iVar143;
            auVar94 = pshufhw(auVar104,auVar18,0x84);
            auVar111 = pshufhw(auVar80,auVar140,0x84);
            auVar69._8_4_ = 0xffffffff;
            auVar69._0_8_ = 0xffffffffffffffff;
            auVar69._12_4_ = 0xffffffff;
            auVar69 = (auVar111 | auVar94 & auVar80) ^ auVar69;
            auVar80 = packssdw(auVar69,auVar69);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80._0_4_ >> 0x18 & 1) != 0) {
              puVar55[0xff] = '\0';
            }
            auVar80 = auVar148 ^ auVar50;
            auVar105._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
            auVar105._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
            auVar105._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
            auVar105._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
            auVar19._4_4_ = auVar105._0_4_;
            auVar19._0_4_ = auVar105._0_4_;
            auVar19._8_4_ = auVar105._8_4_;
            auVar19._12_4_ = auVar105._8_4_;
            auVar94 = pshuflw(auVar140,auVar19,0xe8);
            auVar70._0_4_ = -(uint)(auVar80._0_4_ == iVar77);
            auVar70._4_4_ = -(uint)(auVar80._4_4_ == iVar79);
            auVar70._8_4_ = -(uint)(auVar80._8_4_ == iVar83);
            auVar70._12_4_ = -(uint)(auVar80._12_4_ == iVar84);
            auVar127._4_4_ = auVar70._4_4_;
            auVar127._0_4_ = auVar70._4_4_;
            auVar127._8_4_ = auVar70._12_4_;
            auVar127._12_4_ = auVar70._12_4_;
            auVar80 = pshuflw(auVar70,auVar127,0xe8);
            auVar128._4_4_ = auVar105._4_4_;
            auVar128._0_4_ = auVar105._4_4_;
            auVar128._8_4_ = auVar105._12_4_;
            auVar128._12_4_ = auVar105._12_4_;
            auVar111 = pshuflw(auVar105,auVar128,0xe8);
            auVar41._8_4_ = 0xffffffff;
            auVar41._0_8_ = 0xffffffffffffffff;
            auVar41._12_4_ = 0xffffffff;
            auVar80 = packssdw(auVar80 & auVar94,(auVar111 | auVar80 & auVar94) ^ auVar41);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar55[0x17f] = '\0';
            }
            auVar20._4_4_ = auVar105._0_4_;
            auVar20._0_4_ = auVar105._0_4_;
            auVar20._8_4_ = auVar105._8_4_;
            auVar20._12_4_ = auVar105._8_4_;
            auVar128 = auVar127 & auVar20 | auVar128;
            auVar111 = packssdw(auVar128,auVar128);
            auVar42._8_4_ = 0xffffffff;
            auVar42._0_8_ = 0xffffffffffffffff;
            auVar42._12_4_ = 0xffffffff;
            auVar80 = packssdw(auVar80,auVar111 ^ auVar42);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80._4_2_ >> 8 & 1) != 0) {
              puVar55[0x1ff] = '\0';
            }
            auVar80 = auVar150 ^ auVar50;
            auVar106._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
            auVar106._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
            auVar106._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
            auVar106._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
            auVar129._4_4_ = auVar106._0_4_;
            auVar129._0_4_ = auVar106._0_4_;
            auVar129._8_4_ = auVar106._8_4_;
            auVar129._12_4_ = auVar106._8_4_;
            iVar136 = -(uint)(auVar80._4_4_ == iVar79);
            iVar143 = -(uint)(auVar80._12_4_ == iVar84);
            auVar21._4_4_ = iVar136;
            auVar21._0_4_ = iVar136;
            auVar21._8_4_ = iVar143;
            auVar21._12_4_ = iVar143;
            auVar141._4_4_ = auVar106._4_4_;
            auVar141._0_4_ = auVar106._4_4_;
            auVar141._8_4_ = auVar106._12_4_;
            auVar141._12_4_ = auVar106._12_4_;
            auVar80 = auVar21 & auVar129 | auVar141;
            auVar80 = packssdw(auVar80,auVar80);
            auVar43._8_4_ = 0xffffffff;
            auVar43._0_8_ = 0xffffffffffffffff;
            auVar43._12_4_ = 0xffffffff;
            auVar80 = packssdw(auVar80 ^ auVar43,auVar80 ^ auVar43);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar55[0x27f] = '\0';
            }
            auVar80 = pshufhw(auVar80,auVar129,0x84);
            auVar22._4_4_ = iVar136;
            auVar22._0_4_ = iVar136;
            auVar22._8_4_ = iVar143;
            auVar22._12_4_ = iVar143;
            auVar94 = pshufhw(auVar106,auVar22,0x84);
            auVar111 = pshufhw(auVar80,auVar141,0x84);
            auVar71._8_4_ = 0xffffffff;
            auVar71._0_8_ = 0xffffffffffffffff;
            auVar71._12_4_ = 0xffffffff;
            auVar71 = (auVar111 | auVar94 & auVar80) ^ auVar71;
            auVar80 = packssdw(auVar71,auVar71);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80._6_2_ >> 8 & 1) != 0) {
              puVar55[0x2ff] = '\0';
            }
            auVar80 = auVar92 ^ auVar50;
            auVar107._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
            auVar107._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
            auVar107._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
            auVar107._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
            auVar23._4_4_ = auVar107._0_4_;
            auVar23._0_4_ = auVar107._0_4_;
            auVar23._8_4_ = auVar107._8_4_;
            auVar23._12_4_ = auVar107._8_4_;
            auVar94 = pshuflw(auVar141,auVar23,0xe8);
            auVar72._0_4_ = -(uint)(auVar80._0_4_ == iVar77);
            auVar72._4_4_ = -(uint)(auVar80._4_4_ == iVar79);
            auVar72._8_4_ = -(uint)(auVar80._8_4_ == iVar83);
            auVar72._12_4_ = -(uint)(auVar80._12_4_ == iVar84);
            auVar130._4_4_ = auVar72._4_4_;
            auVar130._0_4_ = auVar72._4_4_;
            auVar130._8_4_ = auVar72._12_4_;
            auVar130._12_4_ = auVar72._12_4_;
            auVar80 = pshuflw(auVar72,auVar130,0xe8);
            auVar131._4_4_ = auVar107._4_4_;
            auVar131._0_4_ = auVar107._4_4_;
            auVar131._8_4_ = auVar107._12_4_;
            auVar131._12_4_ = auVar107._12_4_;
            auVar111 = pshuflw(auVar107,auVar131,0xe8);
            auVar108._8_4_ = 0xffffffff;
            auVar108._0_8_ = 0xffffffffffffffff;
            auVar108._12_4_ = 0xffffffff;
            auVar108 = (auVar111 | auVar80 & auVar94) ^ auVar108;
            auVar111 = packssdw(auVar108,auVar108);
            auVar80 = packsswb(auVar80 & auVar94,auVar111);
            if ((auVar80 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar55[0x37f] = '\0';
            }
            auVar24._4_4_ = auVar107._0_4_;
            auVar24._0_4_ = auVar107._0_4_;
            auVar24._8_4_ = auVar107._8_4_;
            auVar24._12_4_ = auVar107._8_4_;
            auVar131 = auVar130 & auVar24 | auVar131;
            auVar111 = packssdw(auVar131,auVar131);
            auVar44._8_4_ = 0xffffffff;
            auVar44._0_8_ = 0xffffffffffffffff;
            auVar44._12_4_ = 0xffffffff;
            auVar111 = packssdw(auVar111 ^ auVar44,auVar111 ^ auVar44);
            auVar80 = packsswb(auVar80,auVar111);
            if ((auVar80._8_2_ >> 8 & 1) != 0) {
              puVar55[0x3ff] = '\0';
            }
            auVar80 = auVar90 ^ auVar50;
            auVar109._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
            auVar109._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
            auVar109._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
            auVar109._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
            auVar132._4_4_ = auVar109._0_4_;
            auVar132._0_4_ = auVar109._0_4_;
            auVar132._8_4_ = auVar109._8_4_;
            auVar132._12_4_ = auVar109._8_4_;
            iVar136 = -(uint)(auVar80._4_4_ == iVar79);
            iVar143 = -(uint)(auVar80._12_4_ == iVar84);
            auVar25._4_4_ = iVar136;
            auVar25._0_4_ = iVar136;
            auVar25._8_4_ = iVar143;
            auVar25._12_4_ = iVar143;
            auVar142._4_4_ = auVar109._4_4_;
            auVar142._0_4_ = auVar109._4_4_;
            auVar142._8_4_ = auVar109._12_4_;
            auVar142._12_4_ = auVar109._12_4_;
            auVar80 = auVar25 & auVar132 | auVar142;
            auVar80 = packssdw(auVar80,auVar80);
            auVar45._8_4_ = 0xffffffff;
            auVar45._0_8_ = 0xffffffffffffffff;
            auVar45._12_4_ = 0xffffffff;
            auVar80 = packssdw(auVar80 ^ auVar45,auVar80 ^ auVar45);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar55[0x47f] = '\0';
            }
            auVar80 = pshufhw(auVar80,auVar132,0x84);
            auVar26._4_4_ = iVar136;
            auVar26._0_4_ = iVar136;
            auVar26._8_4_ = iVar143;
            auVar26._12_4_ = iVar143;
            auVar94 = pshufhw(auVar109,auVar26,0x84);
            auVar111 = pshufhw(auVar80,auVar142,0x84);
            auVar73._8_4_ = 0xffffffff;
            auVar73._0_8_ = 0xffffffffffffffff;
            auVar73._12_4_ = 0xffffffff;
            auVar73 = (auVar111 | auVar94 & auVar80) ^ auVar73;
            auVar80 = packssdw(auVar73,auVar73);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80._10_2_ >> 8 & 1) != 0) {
              puVar55[0x4ff] = '\0';
            }
            auVar80 = auVar88 ^ auVar50;
            auVar110._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
            auVar110._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
            auVar110._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
            auVar110._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
            auVar27._4_4_ = auVar110._0_4_;
            auVar27._0_4_ = auVar110._0_4_;
            auVar27._8_4_ = auVar110._8_4_;
            auVar27._12_4_ = auVar110._8_4_;
            auVar94 = pshuflw(auVar142,auVar27,0xe8);
            auVar74._0_4_ = -(uint)(auVar80._0_4_ == iVar77);
            auVar74._4_4_ = -(uint)(auVar80._4_4_ == iVar79);
            auVar74._8_4_ = -(uint)(auVar80._8_4_ == iVar83);
            auVar74._12_4_ = -(uint)(auVar80._12_4_ == iVar84);
            auVar133._4_4_ = auVar74._4_4_;
            auVar133._0_4_ = auVar74._4_4_;
            auVar133._8_4_ = auVar74._12_4_;
            auVar133._12_4_ = auVar74._12_4_;
            auVar80 = pshuflw(auVar74,auVar133,0xe8);
            auVar134._4_4_ = auVar110._4_4_;
            auVar134._0_4_ = auVar110._4_4_;
            auVar134._8_4_ = auVar110._12_4_;
            auVar134._12_4_ = auVar110._12_4_;
            auVar111 = pshuflw(auVar110,auVar134,0xe8);
            auVar46._8_4_ = 0xffffffff;
            auVar46._0_8_ = 0xffffffffffffffff;
            auVar46._12_4_ = 0xffffffff;
            auVar80 = packssdw(auVar80 & auVar94,(auVar111 | auVar80 & auVar94) ^ auVar46);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar55[0x57f] = '\0';
            }
            auVar28._4_4_ = auVar110._0_4_;
            auVar28._0_4_ = auVar110._0_4_;
            auVar28._8_4_ = auVar110._8_4_;
            auVar28._12_4_ = auVar110._8_4_;
            auVar134 = auVar133 & auVar28 | auVar134;
            auVar111 = packssdw(auVar134,auVar134);
            auVar47._8_4_ = 0xffffffff;
            auVar47._0_8_ = 0xffffffffffffffff;
            auVar47._12_4_ = 0xffffffff;
            auVar80 = packssdw(auVar80,auVar111 ^ auVar47);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80._12_2_ >> 8 & 1) != 0) {
              puVar55[0x5ff] = '\0';
            }
            auVar80 = auVar85 ^ auVar50;
            in_XMM7._0_4_ = -(uint)(iVar77 < auVar80._0_4_);
            in_XMM7._4_4_ = -(uint)(iVar79 < auVar80._4_4_);
            in_XMM7._8_4_ = -(uint)(iVar83 < auVar80._8_4_);
            in_XMM7._12_4_ = -(uint)(iVar84 < auVar80._12_4_);
            auVar135._4_4_ = in_XMM7._0_4_;
            auVar135._0_4_ = in_XMM7._0_4_;
            auVar135._8_4_ = in_XMM7._8_4_;
            auVar135._12_4_ = in_XMM7._8_4_;
            iVar77 = -(uint)(auVar80._4_4_ == iVar79);
            iVar79 = -(uint)(auVar80._12_4_ == iVar84);
            auVar82._4_4_ = iVar77;
            auVar82._0_4_ = iVar77;
            auVar82._8_4_ = iVar79;
            auVar82._12_4_ = iVar79;
            auVar75._4_4_ = in_XMM7._4_4_;
            auVar75._0_4_ = in_XMM7._4_4_;
            auVar75._8_4_ = in_XMM7._12_4_;
            auVar75._12_4_ = in_XMM7._12_4_;
            auVar75 = auVar82 & auVar135 | auVar75;
            auVar80 = packssdw(auVar75,auVar75);
            auVar48._8_4_ = 0xffffffff;
            auVar48._0_8_ = 0xffffffffffffffff;
            auVar48._12_4_ = 0xffffffff;
            auVar80 = packssdw(auVar80 ^ auVar48,auVar80 ^ auVar48);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar55[0x67f] = '\0';
            }
            auVar80 = pshufhw(auVar80,auVar135,0x84);
            auVar94 = pshufhw(auVar82,auVar82,0x84);
            auVar29._4_4_ = in_XMM7._4_4_;
            auVar29._0_4_ = in_XMM7._4_4_;
            auVar29._8_4_ = in_XMM7._12_4_;
            auVar29._12_4_ = in_XMM7._12_4_;
            auVar111 = pshufhw(auVar80,auVar29,0x84);
            auVar76._8_4_ = 0xffffffff;
            auVar76._0_8_ = 0xffffffffffffffff;
            auVar76._12_4_ = 0xffffffff;
            auVar76 = (auVar111 | auVar94 & auVar80) ^ auVar76;
            auVar80 = packssdw(auVar76,auVar76);
            auVar80 = packsswb(auVar80,auVar80);
            if ((auVar80._14_2_ >> 8 & 1) != 0) {
              puVar55[0x6ff] = '\0';
            }
            auVar145._0_8_ = auVar144._0_8_ + 0x10;
            auVar145._8_8_ = auVar144._8_8_ + 0x10;
            auVar147._0_8_ = auVar146._0_8_ + 0x10;
            auVar147._8_8_ = auVar146._8_8_ + 0x10;
            auVar149._0_8_ = auVar148._0_8_ + 0x10;
            auVar149._8_8_ = auVar148._8_8_ + 0x10;
            auVar151._0_8_ = auVar150._0_8_ + 0x10;
            auVar151._8_8_ = auVar150._8_8_ + 0x10;
            auVar93._0_8_ = auVar92._0_8_ + 0x10;
            auVar93._8_8_ = auVar92._8_8_ + 0x10;
            auVar91._0_8_ = auVar90._0_8_ + 0x10;
            auVar91._8_8_ = auVar90._8_8_ + 0x10;
            auVar89._0_8_ = auVar88._0_8_ + 0x10;
            auVar89._8_8_ = auVar88._8_8_ + 0x10;
            auVar86._0_8_ = auVar85._0_8_ + 0x10;
            auVar86._8_8_ = auVar85._8_8_ + 0x10;
            uVar58 = uVar58 - 0x10;
            puVar55 = puVar55 + 0x800;
            auVar85 = auVar86;
            auVar88 = auVar89;
            auVar90 = auVar91;
            auVar92 = auVar93;
            auVar144 = auVar145;
            auVar146 = auVar147;
            auVar148 = auVar149;
            auVar150 = auVar151;
          } while (uVar58 != 0);
        }
        uVar59 = uVar59 + 1;
        puVar56 = puVar56 + 1;
      } while (uVar59 != (local_58 * 4 | 2));
    }
  }
  do {
    cVar1 = *__dest;
    if (cVar1 == '\n') {
      y = y + 6;
      iVar51 = iVar57;
    }
    else {
      if (cVar1 == '\0') {
        *(undefined8 *)((long)&uStack_60 + lVar49) = 0x11faf7;
        refreshDisplay();
        *(undefined8 *)((long)&uStack_60 + lVar49) = 0x11fafc;
        iVar51 = md_readchar();
        *(undefined8 *)((long)&uStack_60 + lVar49) = 0x11fb03;
        drawMap();
        *(undefined8 *)((long)&uStack_60 + lVar49) = 0x11fb08;
        refreshDisplay();
        return iVar51;
      }
      *(undefined8 *)((long)&uStack_60 + lVar49) = 0x11fae0;
      drawChar(iVar51,y,(int)cVar1);
      iVar51 = iVar51 + 4;
    }
    __dest = __dest + 1;
  } while( true );
}

Assistant:

int displayMessage(const char* msg_buffer)
{
    char buffer[strlen(msg_buffer) + 32];
    strcpy(buffer, msg_buffer);
    
    int max_line_width = (DISPLAY_WIDTH * 2 / 3) / 4;
    int width, line_count;
    lineWrapString(buffer, max_line_width, "", &width, &line_count);
    
    drawMap();
    int x = (DISPLAY_WIDTH - width * 4) / 2;
    int y = (DISPLAY_HEIGHT - line_count * 6) / 2;
    int sx = x;
    fillBox(x - 2, y - 2, width * 4 + 4, line_count * 6 + 5, 255);
    fillBox(x - 1, y - 1, width * 4 + 2, line_count * 6 + 2, 0);
    for(const char* c=buffer; *c; c++)
    {
        if (*c == '\n')
        {
            x = sx;
            y += 6;
        }else{
            drawChar(x, y, *c);
            x += 4;
        }
    }
    
    refreshDisplay();
    int ch = md_readchar();
    refreshMap();
    return ch;
}